

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# code_simulation_helpers.hpp
# Opt level: O1

void LDPC4QKD::CodeSimulationHelpers::noise_bitstring_inplace<bool>
               (mt19937_64 *rng,vector<bool,_std::allocator<bool>_> *src,double err_prob)

{
  _Bit_type *p_Var1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  _Adaptor<std::mersenne_twister_engine<unsigned_long,_64UL,_312UL,_156UL,_31UL,_13043109905998158313UL,_29UL,_6148914691236517205UL,_17UL,_8202884508482404352UL,_37UL,_18444473444759240704UL,_43UL,_6364136223846793005UL>,_double>
  __aurng;
  ulong uVar6;
  double dVar7;
  
  if (((long)(src->super__Bvector_base<std::allocator<bool>_>)._M_impl.super__Bvector_impl_data.
             _M_finish.super__Bit_iterator_base._M_p -
      (long)(src->super__Bvector_base<std::allocator<bool>_>)._M_impl.super__Bvector_impl_data.
            _M_start.super__Bit_iterator_base._M_p) * 8 +
      (ulong)(src->super__Bvector_base<std::allocator<bool>_>)._M_impl.super__Bvector_impl_data.
             _M_finish.super__Bit_iterator_base._M_offset != 0) {
    uVar6 = 0;
    do {
      dVar7 = std::
              generate_canonical<double,53ul,std::mersenne_twister_engine<unsigned_long,64ul,312ul,156ul,31ul,13043109905998158313ul,29ul,6148914691236517205ul,17ul,8202884508482404352ul,37ul,18444473444759240704ul,43ul,6364136223846793005ul>>
                        (rng);
      uVar2 = uVar6 + 0x3f;
      if (-1 < (long)uVar6) {
        uVar2 = uVar6;
      }
      p_Var1 = (src->super__Bvector_base<std::allocator<bool>_>)._M_impl.super__Bvector_impl_data.
               _M_start.super__Bit_iterator_base._M_p;
      uVar4 = (ulong)((uVar6 & 0x800000000000003f) < 0x8000000000000001);
      uVar5 = 1L << ((byte)uVar6 & 0x3f);
      uVar3 = p_Var1[((long)uVar2 >> 6) + uVar4 + 0xffffffffffffffff];
      if (err_prob <= dVar7) {
        if ((uVar3 & uVar5) != 0) goto LAB_00118410;
LAB_00118403:
        uVar3 = uVar3 & ~uVar5;
      }
      else {
        if ((uVar3 & uVar5) != 0) goto LAB_00118403;
LAB_00118410:
        uVar3 = uVar3 | uVar5;
      }
      p_Var1[((long)uVar2 >> 6) + uVar4 + 0xffffffffffffffff] = uVar3;
      uVar6 = uVar6 + 1;
    } while (uVar6 < (ulong)(src->super__Bvector_base<std::allocator<bool>_>)._M_impl.
                            super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_offset +
                     ((long)(src->super__Bvector_base<std::allocator<bool>_>)._M_impl.
                            super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p -
                     (long)(src->super__Bvector_base<std::allocator<bool>_>)._M_impl.
                           super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p) * 8);
  }
  return;
}

Assistant:

void noise_bitstring_inplace(std::mt19937_64 &rng, std::vector<T> &src, double err_prob) {
        std::bernoulli_distribution distribution(err_prob);

        for (std::size_t i = 0; i < src.size(); i++) {
            if (distribution(rng)) {
                src[i] = !src[i];
            } else {
                src[i] = src[i];
            }
        }
    }